

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::attachment_reference2_is_supported
          (Impl *this,VkAttachmentReference2 *ref)

{
  bool bVar1;
  VkAttachmentReference2 *ref_local;
  Impl *this_local;
  
  bVar1 = pnext_chain_is_supported(this,ref->pNext);
  if (bVar1) {
    bVar1 = image_layout_is_supported(this,ref->layout);
    if (bVar1) {
      bVar1 = aspect_mask_is_supported(this,ref->aspectMask);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::attachment_reference2_is_supported(const VkAttachmentReference2 &ref) const
{
	if (!pnext_chain_is_supported(ref.pNext))
		return false;
	if (!image_layout_is_supported(ref.layout))
		return false;
	if (!aspect_mask_is_supported(ref.aspectMask))
		return false;

	return true;
}